

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O3

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::DecimalTypeInfo::Deserialize(DecimalTypeInfo *this,Deserializer *deserializer)

{
  uint8_t uVar1;
  uint uVar2;
  DecimalTypeInfo *pDVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar5;
  shared_ptr<duckdb::DecimalTypeInfo,_true> local_38;
  int iVar3;
  
  pDVar4 = (DecimalTypeInfo *)operator_new(0x40);
  DecimalTypeInfo(pDVar4);
  local_38.internal.super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pDVar4;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::DecimalTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.internal.
              super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pDVar4);
  pDVar4 = shared_ptr<duckdb::DecimalTypeInfo,_true>::operator->(&local_38);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"width");
  if ((char)uVar2 == '\0') {
    uVar1 = '\0';
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    uVar1 = (uint8_t)iVar3;
  }
  pDVar4->width = uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pDVar4 = shared_ptr<duckdb::DecimalTypeInfo,_true>::operator->(&local_38);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"scale");
  if ((char)uVar2 == '\0') {
    uVar1 = '\0';
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    uVar1 = (uint8_t)iVar3;
  }
  pDVar4->scale = uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_38.internal.super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_38.internal.super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> DecimalTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<DecimalTypeInfo>(new DecimalTypeInfo());
	deserializer.ReadPropertyWithDefault<uint8_t>(200, "width", result->width);
	deserializer.ReadPropertyWithDefault<uint8_t>(201, "scale", result->scale);
	return std::move(result);
}